

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O0

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
parseDirectiveLoadElf(Parser *parser,int flags)

{
  StringLiteral *this;
  bool bVar1;
  reference pvVar2;
  size_type sVar3;
  undefined4 in_register_00000034;
  path local_f8;
  undefined1 local_d8 [40];
  path local_b0;
  undefined1 local_90 [16];
  StringLiteral outputName;
  StringLiteral inputName;
  undefined1 local_38 [8];
  vector<Expression,_std::allocator<Expression>_> list;
  int flags_local;
  Parser *parser_local;
  
  std::vector<Expression,_std::allocator<Expression>_>::vector
            ((vector<Expression,_std::allocator<Expression>_> *)local_38);
  bVar1 = Parser::parseExpressionList
                    ((Parser *)CONCAT44(in_register_00000034,flags),
                     (vector<Expression,_std::allocator<Expression>_> *)local_38,1,2);
  if (bVar1) {
    this = (StringLiteral *)((long)&outputName._value.field_2 + 8);
    StringLiteral::StringLiteral(this);
    StringLiteral::StringLiteral((StringLiteral *)(local_90 + 8));
    pvVar2 = std::vector<Expression,_std::allocator<Expression>_>::operator[]
                       ((vector<Expression,_std::allocator<Expression>_> *)local_38,0);
    bVar1 = Expression::evaluateString(pvVar2,this,true);
    if (bVar1) {
      sVar3 = std::vector<Expression,_std::allocator<Expression>_>::size
                        ((vector<Expression,_std::allocator<Expression>_> *)local_38);
      if (sVar3 == 2) {
        pvVar2 = std::vector<Expression,_std::allocator<Expression>_>::operator[]
                           ((vector<Expression,_std::allocator<Expression>_> *)local_38,1);
        bVar1 = Expression::evaluateString(pvVar2,(StringLiteral *)(local_90 + 8),true);
        if (bVar1) {
          StringLiteral::path(&local_b0,(StringLiteral *)((long)&outputName._value.field_2 + 8));
          StringLiteral::path((path *)(local_d8 + 8),(StringLiteral *)(local_90 + 8));
          std::make_unique<DirectiveLoadMipsElf,ghc::filesystem::path,ghc::filesystem::path>
                    ((path *)local_90,&local_b0);
          std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
          unique_ptr<DirectiveLoadMipsElf,std::default_delete<DirectiveLoadMipsElf>,void>
                    ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
                     (unique_ptr<DirectiveLoadMipsElf,_std::default_delete<DirectiveLoadMipsElf>_> *
                     )local_90);
          std::unique_ptr<DirectiveLoadMipsElf,_std::default_delete<DirectiveLoadMipsElf>_>::
          ~unique_ptr((unique_ptr<DirectiveLoadMipsElf,_std::default_delete<DirectiveLoadMipsElf>_>
                       *)local_90);
          ghc::filesystem::path::~path((path *)(local_d8 + 8));
          ghc::filesystem::path::~path(&local_b0);
        }
        else {
          std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
          unique_ptr<std::default_delete<CAssemblerCommand>,void>
                    ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
                     (nullptr_t)0x0);
        }
      }
      else {
        StringLiteral::path(&local_f8,(StringLiteral *)((long)&outputName._value.field_2 + 8));
        std::make_unique<DirectiveLoadMipsElf,ghc::filesystem::path>((path *)local_d8);
        std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
        unique_ptr<DirectiveLoadMipsElf,std::default_delete<DirectiveLoadMipsElf>,void>
                  ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
                   (unique_ptr<DirectiveLoadMipsElf,_std::default_delete<DirectiveLoadMipsElf>_> *)
                   local_d8);
        std::unique_ptr<DirectiveLoadMipsElf,_std::default_delete<DirectiveLoadMipsElf>_>::
        ~unique_ptr((unique_ptr<DirectiveLoadMipsElf,_std::default_delete<DirectiveLoadMipsElf>_> *)
                    local_d8);
        ghc::filesystem::path::~path(&local_f8);
      }
    }
    else {
      std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
      unique_ptr<std::default_delete<CAssemblerCommand>,void>
                ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
                 (nullptr_t)0x0);
    }
    StringLiteral::~StringLiteral((StringLiteral *)(local_90 + 8));
    StringLiteral::~StringLiteral((StringLiteral *)((long)&outputName._value.field_2 + 8));
  }
  else {
    std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
    unique_ptr<std::default_delete<CAssemblerCommand>,void>
              ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
               (nullptr_t)0x0);
  }
  std::vector<Expression,_std::allocator<Expression>_>::~vector
            ((vector<Expression,_std::allocator<Expression>_> *)local_38);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         parser;
}

Assistant:

std::unique_ptr<CAssemblerCommand> parseDirectiveLoadElf(Parser& parser, int flags)
{
	std::vector<Expression> list;
	if (!parser.parseExpressionList(list,1,2))
		return nullptr;

	StringLiteral inputName, outputName;
	if (!list[0].evaluateString(inputName,true))
		return nullptr;

	if (list.size() == 2)
	{
		if (!list[1].evaluateString(outputName,true))
			return nullptr;
		return std::make_unique<DirectiveLoadMipsElf>(inputName.path(),outputName.path());
	} else {
		return std::make_unique<DirectiveLoadMipsElf>(inputName.path());
	}
}